

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftpcommon.c
# Opt level: O2

void list_directory_from_sftp_finish(list_directory_from_sftp_ctx *ctx)

{
  size_t i;
  ulong uVar1;
  
  if (ctx->nnames != 0) {
    if (ctx->sorting == false) {
      __assert_fail("ctx->sorting",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/psftpcommon.c"
                    ,0x61,
                    "void list_directory_from_sftp_finish(struct list_directory_from_sftp_ctx *)");
    }
    qsort(ctx->names,ctx->nnames,8,sftp_name_compare);
    for (uVar1 = 0; uVar1 < ctx->nnames; uVar1 = uVar1 + 1) {
      list_directory_from_sftp_print(ctx->names[uVar1]);
    }
  }
  return;
}

Assistant:

void list_directory_from_sftp_finish(struct list_directory_from_sftp_ctx *ctx)
{
    if (ctx->nnames > 0) {
        assert(ctx->sorting);
        qsort(ctx->names, ctx->nnames, sizeof(*ctx->names), sftp_name_compare);
        for (size_t i = 0; i < ctx->nnames; i++)
            list_directory_from_sftp_print(ctx->names[i]);
    }
}